

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

triState toTriState(optFoldingType option)

{
  optFoldingType option_local;
  
  if (option != optFoldingDefault) {
    if (option == optNoFolding) {
      return _False;
    }
    if (option == optFolding) {
      return _True;
    }
  }
  return unset;
}

Assistant:

static inline triState toTriState(optFoldingType option)
{
    switch (option)
    {
    case optFoldingDefault:
        break;
    case optNoFolding:
        return _False;
    case optFolding:
        return _True;
    }
    return unset;
}